

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

bool __thiscall
randomx::SuperscalarInstruction::selectSource
          (SuperscalarInstruction *this,int cycle,RegisterInfo (*registers) [8],Blake2Generator *gen
          )

{
  bool bVar1;
  SuperscalarInstructionType SVar2;
  size_type sVar3;
  reference pvVar4;
  long in_RDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  uint i;
  vector<int,_std::allocator<int>_> availableRegisters;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Blake2Generator *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  uint uVar5;
  uint uVar6;
  vector<int,_std::allocator<int>_> local_40;
  long local_20;
  int local_14;
  byte local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13648b);
  uVar5 = 0;
  while (uVar5 < 8) {
    uVar6 = uVar5;
    if (*(int *)(local_20 + (ulong)uVar5 * 0x10) <= local_14) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RDI,(value_type_conflict1 *)
                        CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_stack_ffffffffffffffb8 = uVar5;
    }
    uVar5 = uVar6 + 1;
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_40);
  if (((sVar3 == 2) &&
      (SVar2 = SuperscalarInstructionInfo::getType
                         ((SuperscalarInstructionInfo *)
                          (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start), SVar2 == IADD_RS)) &&
     ((pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,0), *pvVar4 == 5 ||
      (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,1), *pvVar4 == 5)))) {
    *(undefined4 *)
     &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = 5;
    *(undefined4 *)
     ((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start + 4) = 5;
    local_1 = 1;
  }
  else {
    bVar1 = selectRegister((vector<int,_std::allocator<int>_> *)
                           CONCAT44(uVar5,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
                           (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (bVar1) {
      if (((ulong)in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish & 0x100) != 0) {
        *(undefined4 *)
         ((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) =
             *(undefined4 *)
              &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0);
  return (bool)(local_1 & 1);
}

Assistant:

bool selectSource(int cycle, RegisterInfo(&registers)[8], Blake2Generator& gen) {
			std::vector<int> availableRegisters;
			//all registers that are ready at the cycle
			for (unsigned i = 0; i < 8; ++i) {
				if (registers[i].latency <= cycle)
					availableRegisters.push_back(i);
			}
			//if there are only 2 available registers for IADD_RS and one of them is r5, select it as the source because it cannot be the destination
			if (availableRegisters.size() == 2 && info_->getType() == SuperscalarInstructionType::IADD_RS) {
				if (availableRegisters[0] == RegisterNeedsDisplacement || availableRegisters[1] == RegisterNeedsDisplacement) {
					opGroupPar_ = src_ = RegisterNeedsDisplacement;
					return true;
				}
			}
			if (selectRegister(availableRegisters, gen, src_)) {
				if (groupParIsSource_)
					opGroupPar_ = src_;
				return true;
			}
			return false;
		}